

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_session_copy(mbedtls_ssl_session *dst,mbedtls_ssl_session *src)

{
  int iVar1;
  mbedtls_x509_crt *pmVar2;
  uchar *puVar3;
  int ret;
  mbedtls_ssl_session *src_local;
  mbedtls_ssl_session *dst_local;
  
  mbedtls_ssl_session_free(dst);
  memcpy(dst,src,0x98);
  if (src->peer_cert != (mbedtls_x509_crt *)0x0) {
    pmVar2 = (mbedtls_x509_crt *)calloc(1,0x228);
    dst->peer_cert = pmVar2;
    if (dst->peer_cert == (mbedtls_x509_crt *)0x0) {
      return -0x7f00;
    }
    mbedtls_x509_crt_init(dst->peer_cert);
    iVar1 = mbedtls_x509_crt_parse_der
                      (dst->peer_cert,(src->peer_cert->raw).p,(src->peer_cert->raw).len);
    if (iVar1 != 0) {
      free(dst->peer_cert);
      dst->peer_cert = (mbedtls_x509_crt *)0x0;
      return iVar1;
    }
  }
  if (src->ticket != (uchar *)0x0) {
    puVar3 = (uchar *)calloc(1,src->ticket_len);
    dst->ticket = puVar3;
    if (dst->ticket == (uchar *)0x0) {
      return -0x7f00;
    }
    memcpy(dst->ticket,src->ticket,src->ticket_len);
  }
  return 0;
}

Assistant:

static int ssl_session_copy( mbedtls_ssl_session *dst, const mbedtls_ssl_session *src )
{
    mbedtls_ssl_session_free( dst );
    memcpy( dst, src, sizeof( mbedtls_ssl_session ) );

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( src->peer_cert != NULL )
    {
        int ret;

        dst->peer_cert = mbedtls_calloc( 1, sizeof(mbedtls_x509_crt) );
        if( dst->peer_cert == NULL )
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

        mbedtls_x509_crt_init( dst->peer_cert );

        if( ( ret = mbedtls_x509_crt_parse_der( dst->peer_cert, src->peer_cert->raw.p,
                                        src->peer_cert->raw.len ) ) != 0 )
        {
            mbedtls_free( dst->peer_cert );
            dst->peer_cert = NULL;
            return( ret );
        }
    }
#endif /* MBEDTLS_X509_CRT_PARSE_C */

#if defined(MBEDTLS_SSL_SESSION_TICKETS) && defined(MBEDTLS_SSL_CLI_C)
    if( src->ticket != NULL )
    {
        dst->ticket = mbedtls_calloc( 1, src->ticket_len );
        if( dst->ticket == NULL )
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

        memcpy( dst->ticket, src->ticket, src->ticket_len );
    }
#endif /* MBEDTLS_SSL_SESSION_TICKETS && MBEDTLS_SSL_CLI_C */

    return( 0 );
}